

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O1

void quantize_row_q6_K_ref(float *x,block_q6_K *y,int64_t k)

{
  char cVar1;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  long lVar14;
  block_q6_K *pbVar15;
  float *pfVar16;
  uint8_t *puVar17;
  ushort uVar18;
  float fVar19;
  undefined1 *puVar20;
  int8_t *piVar21;
  long lVar22;
  float *in_R9;
  int8_t *piVar23;
  long lVar24;
  int ib;
  long lVar25;
  bool bVar26;
  float fVar27;
  float fVar28;
  undefined1 auVar29 [16];
  short sVar30;
  anon_union_4_2_5fd15f10 fp32;
  float fVar31;
  uint uVar32;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  undefined1 auVar35 [16];
  anon_union_4_2_5fd15f10 fp32_2;
  float fVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  uint uVar47;
  uint uVar48;
  uint uVar49;
  uint uVar50;
  float scales [16];
  int8_t L [256];
  float afStack_178 [16];
  int8_t local_138 [96];
  undefined1 local_d8 [168];
  char cVar2;
  char cVar3;
  char cVar4;
  undefined4 uVar33;
  undefined6 uVar34;
  
  lVar14 = k + 0xff;
  if (-1 < k) {
    lVar14 = k;
  }
  if (0xff < k) {
    piVar21 = y->scales;
    lVar24 = 0;
    do {
      piVar23 = local_138;
      lVar25 = 0;
      fVar28 = 0.0;
      pfVar16 = x;
      fVar19 = 0.0;
      do {
        fVar27 = make_qx_quants(0x10,0x20,pfVar16,piVar23,0,in_R9);
        afStack_178[lVar25] = fVar27;
        fVar39 = ABS(fVar27);
        fVar31 = fVar39;
        if (fVar39 <= fVar19) {
          fVar31 = fVar19;
        }
        fVar28 = (float)(~-(uint)(fVar19 < fVar39) & (uint)fVar28 |
                        (uint)fVar27 & -(uint)(fVar19 < fVar39));
        lVar25 = lVar25 + 1;
        piVar23 = piVar23 + 0x10;
        pfVar16 = pfVar16 + 0x10;
        fVar19 = fVar31;
      } while (lVar25 != 0x10);
      if (1e-15 <= fVar31) {
        fVar28 = -128.0 / fVar28;
        fVar31 = 1.0 / fVar28;
        fVar19 = (float)(((uint)fVar31 & 0x7f800000) + 0x7800000);
        if ((uint)((int)fVar31 * 2) < 0x71000000) {
          fVar19 = 2.0;
        }
        fVar19 = fVar19 + ABS(fVar31) * 5.192297e+33 * 7.70372e-34;
        uVar18 = (SUB42(fVar19,0) & 0xfff) + ((ushort)((uint)fVar19 >> 0xd) & 0x7c00);
        if (0xff000000 < (uint)((int)fVar31 * 2)) {
          uVar18 = 0x7e00;
        }
        pbVar15 = y + lVar24;
        y[lVar24].d = uVar18 | (ushort)((uint)fVar31 >> 0x10) & 0x8000;
        auVar35 = _DAT_0014e820;
        auVar44 = _DAT_0014e730;
        lVar25 = 0;
        uVar47 = (uint)DAT_0014e730;
        uVar48 = DAT_0014e730._4_4_;
        uVar49 = DAT_0014e730._8_4_;
        uVar50 = DAT_0014e730._12_4_;
        do {
          fVar19 = afStack_178[lVar25] * fVar28 + 12582912.0;
          fVar31 = afStack_178[lVar25 + 1] * fVar28 + 12582912.0;
          fVar27 = afStack_178[lVar25 + 2] * fVar28 + 12582912.0;
          fVar39 = afStack_178[lVar25 + 3] * fVar28 + 12582912.0;
          auVar40._0_4_ = -(uint)(0x40007f < ((uint)fVar19 & 0x7fff80));
          auVar40._4_4_ = -(uint)(0x40007f < ((uint)fVar31 & 0x7fff80));
          auVar40._8_4_ = -(uint)(0x40007f < ((uint)fVar27 & 0x7fff80));
          auVar40._12_4_ = -(uint)(0x40007f < ((uint)fVar39 & 0x7fff80));
          auVar40 = packssdw(auVar40,auVar40);
          auVar40 = packsswb(auVar40,auVar40);
          uVar32 = (uint)fVar19 & uVar47;
          uVar36 = (uint)fVar31 & uVar48;
          uVar37 = (uint)fVar27 & uVar49;
          uVar38 = (uint)fVar39 & uVar50;
          sVar5 = (short)uVar32;
          cVar1 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar32 - (0xff < sVar5);
          sVar5 = (short)(uVar32 >> 0x10);
          sVar30 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * (char)(uVar32 >> 0x10) - (0xff < sVar5),
                            cVar1);
          sVar5 = (short)uVar36;
          cVar2 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar36 - (0xff < sVar5);
          sVar5 = (short)(uVar36 >> 0x10);
          uVar33 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * (char)(uVar36 >> 0x10) - (0xff < sVar5),
                            CONCAT12(cVar2,sVar30));
          sVar5 = (short)uVar37;
          cVar3 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar37 - (0xff < sVar5);
          sVar5 = (short)(uVar37 >> 0x10);
          uVar34 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * (char)(uVar37 >> 0x10) - (0xff < sVar5),
                            CONCAT14(cVar3,uVar33));
          sVar5 = (short)uVar38;
          cVar4 = (0 < sVar5) * (sVar5 < 0x100) * (char)uVar38 - (0xff < sVar5);
          sVar7 = (short)(uVar38 >> 0x10);
          sVar5 = (short)((uint)uVar33 >> 0x10);
          sVar6 = (short)((uint6)uVar34 >> 0x20);
          sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * (char)(uVar38 >> 0x10) -
                                   (0xff < sVar7),CONCAT16(cVar4,uVar34)) >> 0x30);
          *(uint *)(piVar21 + lVar25) =
               auVar40._0_4_ & auVar35._0_4_ |
               ~auVar40._0_4_ &
               CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                        CONCAT12((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                 CONCAT11((0 < sVar5) * (sVar5 < 0x100) * cVar2 - (0xff < sVar5),
                                          (0 < sVar30) * (sVar30 < 0x100) * cVar1 - (0xff < sVar30))
                                ));
          auVar13 = _DAT_0014e880;
          auVar12 = _DAT_0014e870;
          auVar11 = _DAT_0014e860;
          auVar10 = _DAT_0014e850;
          auVar9 = _DAT_0014e780;
          auVar8 = _DAT_0014e770;
          auVar40 = _DAT_0014e5d0;
          lVar25 = lVar25 + 4;
        } while (lVar25 != 0x10);
        fVar19 = ggml_table_f32_f16[pbVar15->d];
        piVar23 = local_138;
        lVar25 = 0;
        pfVar16 = x;
        do {
          auVar35._0_4_ = (float)(int)pbVar15->scales[lVar25] * fVar19;
          if ((auVar35._0_4_ != 0.0) || (NAN(auVar35._0_4_))) {
            auVar35._4_4_ = auVar35._0_4_;
            auVar35._8_4_ = auVar35._0_4_;
            auVar35._12_4_ = auVar35._0_4_;
            lVar22 = 0;
            do {
              auVar41 = divps(*(undefined1 (*) [16])(pfVar16 + lVar22),auVar35);
              fVar28 = auVar41._0_4_ + 12582912.0;
              fVar31 = auVar41._4_4_ + 12582912.0;
              auVar42._0_8_ = CONCAT44(fVar31,fVar28) & 0x7fffff007fffff;
              auVar42._8_4_ = (uint)(auVar41._8_4_ + 12582912.0) & 0x7fffff;
              auVar42._12_4_ = (uint)(auVar41._12_4_ + 12582912.0) & 0x7fffff;
              auVar46._0_4_ = -(uint)((int)((uint)fVar28 & 0x7fffff) < (int)DAT_0014e7f0);
              auVar46._4_4_ = -(uint)((int)((uint)fVar31 & 0x7fffff) < DAT_0014e7f0._4_4_);
              auVar46._8_4_ = -(uint)((int)auVar42._8_4_ < DAT_0014e7f0._8_4_);
              auVar46._12_4_ = -(uint)((int)auVar42._12_4_ < DAT_0014e7f0._12_4_);
              auVar42 = ~auVar46 & _DAT_0014e7f0 | auVar42 & auVar46;
              auVar41._0_4_ = -(uint)((int)DAT_0014e830 < auVar42._0_4_);
              auVar41._4_4_ = -(uint)(DAT_0014e830._4_4_ < auVar42._4_4_);
              auVar41._8_4_ = -(uint)(DAT_0014e830._8_4_ < auVar42._8_4_);
              auVar41._12_4_ = -(uint)(DAT_0014e830._12_4_ < auVar42._12_4_);
              auVar41 = (~auVar41 & _DAT_0014e830 | auVar42 & auVar41) & auVar44;
              sVar5 = auVar41._0_2_;
              cVar1 = (0 < sVar5) * (sVar5 < 0x100) * auVar41[0] - (0xff < sVar5);
              sVar5 = auVar41._2_2_;
              sVar30 = CONCAT11((0 < sVar5) * (sVar5 < 0x100) * auVar41[2] - (0xff < sVar5),cVar1);
              sVar5 = auVar41._4_2_;
              cVar2 = (0 < sVar5) * (sVar5 < 0x100) * auVar41[4] - (0xff < sVar5);
              sVar5 = auVar41._6_2_;
              uVar33 = CONCAT13((0 < sVar5) * (sVar5 < 0x100) * auVar41[6] - (0xff < sVar5),
                                CONCAT12(cVar2,sVar30));
              sVar5 = auVar41._8_2_;
              cVar3 = (0 < sVar5) * (sVar5 < 0x100) * auVar41[8] - (0xff < sVar5);
              sVar5 = auVar41._10_2_;
              uVar34 = CONCAT15((0 < sVar5) * (sVar5 < 0x100) * auVar41[10] - (0xff < sVar5),
                                CONCAT14(cVar3,uVar33));
              sVar5 = auVar41._12_2_;
              cVar4 = (0 < sVar5) * (sVar5 < 0x100) * auVar41[0xc] - (0xff < sVar5);
              sVar7 = auVar41._14_2_;
              sVar5 = (short)((uint)uVar33 >> 0x10);
              sVar6 = (short)((uint6)uVar34 >> 0x20);
              sVar7 = (short)(CONCAT17((0 < sVar7) * (sVar7 < 0x100) * auVar41[0xe] - (0xff < sVar7)
                                       ,CONCAT16(cVar4,uVar34)) >> 0x30);
              *(uint *)(piVar23 + lVar22) =
                   CONCAT13(((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7)) + ' ',
                            CONCAT12(((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6)) + ' ',
                                     CONCAT11(((0 < sVar5) * (sVar5 < 0x100) * cVar2 -
                                              (0xff < sVar5)) + ' ',
                                              ((0 < sVar30) * (sVar30 < 0x100) * cVar1 -
                                              (0xff < sVar30)) + ' ')));
              lVar22 = lVar22 + 4;
            } while (lVar22 != 0x10);
          }
          lVar25 = lVar25 + 1;
          piVar23 = piVar23 + 0x10;
          pfVar16 = pfVar16 + 0x10;
        } while (lVar25 != 0x10);
        puVar17 = pbVar15->qh;
        puVar20 = local_d8;
        lVar25 = 0;
        do {
          lVar22 = 0;
          do {
            auVar44 = *(undefined1 (*) [16])(puVar20 + lVar22 + -0x60);
            auVar35 = *(undefined1 (*) [16])(puVar20 + lVar22 + -0x40);
            auVar41 = *(undefined1 (*) [16])(puVar20 + lVar22 + -0x20);
            auVar42 = *(undefined1 (*) [16])(puVar20 + lVar22);
            auVar46 = psllw(auVar41,4);
            *(undefined1 (*) [16])(pbVar15->ql + lVar22) = ~auVar40 & auVar44 | auVar46 & auVar40;
            auVar46 = psllw(auVar42,4);
            *(undefined1 (*) [16])(pbVar15->ql + lVar22 + 0x20) =
                 ~auVar40 & auVar35 | auVar46 & auVar40;
            auVar43._0_2_ = auVar44._0_2_ >> 4;
            auVar43._2_2_ = auVar44._2_2_ >> 4;
            auVar43._4_2_ = auVar44._4_2_ >> 4;
            auVar43._6_2_ = auVar44._6_2_ >> 4;
            auVar43._8_2_ = auVar44._8_2_ >> 4;
            auVar43._10_2_ = auVar44._10_2_ >> 4;
            auVar43._12_2_ = auVar44._12_2_ >> 4;
            auVar43._14_2_ = auVar44._14_2_ >> 4;
            auVar44 = auVar43 & auVar10 ^ auVar11;
            auVar45[0] = auVar44[0] - auVar11[0];
            auVar45[1] = auVar44[1] - auVar11[1];
            auVar45[2] = auVar44[2] - auVar11[2];
            auVar45[3] = auVar44[3] - auVar11[3];
            auVar45[4] = auVar44[4] - auVar11[4];
            auVar45[5] = auVar44[5] - auVar11[5];
            auVar45[6] = auVar44[6] - auVar11[6];
            auVar45[7] = auVar44[7] - auVar11[7];
            auVar45[8] = auVar44[8] - auVar11[8];
            auVar45[9] = auVar44[9] - auVar11[9];
            auVar45[10] = auVar44[10] - auVar11[10];
            auVar45[0xb] = auVar44[0xb] - auVar11[0xb];
            auVar45[0xc] = auVar44[0xc] - auVar11[0xc];
            auVar45[0xd] = auVar44[0xd] - auVar11[0xd];
            auVar45[0xe] = auVar44[0xe] - auVar11[0xe];
            auVar45[0xf] = auVar44[0xf] - auVar11[0xf];
            auVar44._0_2_ = auVar35._0_2_ >> 2;
            auVar44._2_2_ = auVar35._2_2_ >> 2;
            auVar44._4_2_ = auVar35._4_2_ >> 2;
            auVar44._6_2_ = auVar35._6_2_ >> 2;
            auVar44._8_2_ = auVar35._8_2_ >> 2;
            auVar44._10_2_ = auVar35._10_2_ >> 2;
            auVar44._12_2_ = auVar35._12_2_ >> 2;
            auVar44._14_2_ = auVar35._14_2_ >> 2;
            auVar44 = auVar44 & auVar12 ^ auVar13;
            auVar29[0] = auVar44[0] - auVar13[0];
            auVar29[1] = auVar44[1] - auVar13[1];
            auVar29[2] = auVar44[2] - auVar13[2];
            auVar29[3] = auVar44[3] - auVar13[3];
            auVar29[4] = auVar44[4] - auVar13[4];
            auVar29[5] = auVar44[5] - auVar13[5];
            auVar29[6] = auVar44[6] - auVar13[6];
            auVar29[7] = auVar44[7] - auVar13[7];
            auVar29[8] = auVar44[8] - auVar13[8];
            auVar29[9] = auVar44[9] - auVar13[9];
            auVar29[10] = auVar44[10] - auVar13[10];
            auVar29[0xb] = auVar44[0xb] - auVar13[0xb];
            auVar29[0xc] = auVar44[0xc] - auVar13[0xc];
            auVar29[0xd] = auVar44[0xd] - auVar13[0xd];
            auVar29[0xe] = auVar44[0xe] - auVar13[0xe];
            auVar29[0xf] = auVar44[0xf] - auVar13[0xf];
            auVar44 = psllw(auVar42,2);
            *(undefined1 (*) [16])(puVar17 + lVar22) =
                 auVar44 & auVar9 | auVar41 & auVar40 | auVar45 | auVar29 & auVar8;
            lVar22 = lVar22 + 0x10;
          } while (lVar22 != 0x20);
          pbVar15 = (block_q6_K *)(pbVar15->ql + 0x40);
          puVar17 = puVar17 + 0x20;
          puVar20 = puVar20 + 0x80;
          bVar26 = lVar25 == 0;
          lVar25 = lVar25 + 0x80;
        } while (bVar26);
      }
      else {
        memset(y + lVar24,0,0xd2);
      }
      x = x + 0x100;
      lVar24 = lVar24 + 1;
      piVar21 = piVar21 + 0xd2;
    } while (lVar24 != lVar14 >> 8);
  }
  return;
}

Assistant:

void quantize_row_q6_K_ref(const float * GGML_RESTRICT x, block_q6_K * GGML_RESTRICT y, int64_t k) {
    assert(k % QK_K == 0);
    const int64_t nb = k / QK_K;

    int8_t L[QK_K];
    float   scales[QK_K/16];

    for (int i = 0; i < nb; i++) {

        float max_scale = 0;
        float max_abs_scale = 0;

        for (int ib = 0; ib < QK_K/16; ++ib) {

            const float scale = make_qx_quants(16, 32, x + 16*ib, L + 16*ib, 1, NULL);
            scales[ib] = scale;

            const float abs_scale = fabsf(scale);
            if (abs_scale > max_abs_scale) {
                max_abs_scale = abs_scale;
                max_scale = scale;
            }

        }

        if (max_abs_scale < GROUP_MAX_EPS) {
            memset(&y[i], 0, sizeof(block_q6_K));
            y[i].d = GGML_FP32_TO_FP16(0.f);
            x += QK_K;
            continue;
        }

        float iscale = -128.f/max_scale;
        y[i].d = GGML_FP32_TO_FP16(1/iscale);
        for (int ib = 0; ib < QK_K/16; ++ib) {
            y[i].scales[ib] = MIN(127, nearest_int(iscale*scales[ib]));
        }

        for (int j = 0; j < QK_K/16; ++j) {
            float d = GGML_FP16_TO_FP32(y[i].d) * y[i].scales[j];
            if (!d) {
                continue;
            }
            for (int ii = 0; ii < 16; ++ii) {
                int l = nearest_int(x[16*j + ii]/d);
                l = MAX(-32, MIN(31, l));
                L[16*j + ii] = l + 32;
            }
        }

        uint8_t * GGML_RESTRICT ql = y[i].ql;
        uint8_t * GGML_RESTRICT qh = y[i].qh;
        for (int j = 0; j < QK_K; j += 128) {
            for (int l = 0; l < 32; ++l) {
                const uint8_t q1 = L[j + l +  0] & 0xF;
                const uint8_t q2 = L[j + l + 32] & 0xF;
                const uint8_t q3 = L[j + l + 64] & 0xF;
                const uint8_t q4 = L[j + l + 96] & 0xF;
                ql[l+ 0] = q1 | (q3 << 4);
                ql[l+32] = q2 | (q4 << 4);
                qh[l] = (L[j + l] >> 4) | ((L[j + l + 32] >> 4) << 2) | ((L[j + l + 64] >> 4) << 4) | ((L[j + l + 96] >> 4) << 6);
            }
            ql += 64;
            qh += 32;
        }

        x += QK_K;
    }
}